

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSat.c
# Opt level: O3

int Fra_NodesAreImp(Fra_Man_t *p,Aig_Obj_t *pOld,Aig_Obj_t *pNew,int fComplL,int fComplR)

{
  int *piVar1;
  Aig_Obj_t *pAVar2;
  int iVar3;
  int iVar4;
  sat_solver *psVar5;
  long lVar6;
  long lVar7;
  timespec ts;
  timespec local_60;
  Aig_Obj_t *local_50;
  undefined8 local_48;
  lit local_40 [4];
  
  if (((ulong)pNew & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pNew)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSat.c"
                  ,0xd8,"int Fra_NodesAreImp(Fra_Man_t *, Aig_Obj_t *, Aig_Obj_t *, int, int)");
  }
  if (((ulong)pOld & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pOld)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSat.c"
                  ,0xd9,"int Fra_NodesAreImp(Fra_Man_t *, Aig_Obj_t *, Aig_Obj_t *, int, int)");
  }
  if (pNew == pOld) {
    __assert_fail("pNew != pOld",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSat.c"
                  ,0xda,"int Fra_NodesAreImp(Fra_Man_t *, Aig_Obj_t *, Aig_Obj_t *, int, int)");
  }
  iVar4 = p->pPars->nBTLimitNode;
  p->nSatCalls = p->nSatCalls + 1;
  if (p->pSat == (sat_solver *)0x0) {
    psVar5 = sat_solver_new();
    p->pSat = psVar5;
    p->nSatVars = 1;
    sat_solver_setnvars(psVar5,1000);
    local_48 = (ulong)local_48._4_4_ << 0x20;
    sat_solver_addclause(p->pSat,(lit *)&local_48,(lit *)((long)&local_48 + 4));
  }
  Fra_CnfNodeAddToSolver(p,pOld,pNew);
  psVar5 = p->pSat;
  if (psVar5->qtail != psVar5->qhead) {
    iVar3 = sat_solver_simplify(psVar5);
    if (iVar3 == 0) {
      __assert_fail("status != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSat.c"
                    ,0xfe,"int Fra_NodesAreImp(Fra_Man_t *, Aig_Obj_t *, Aig_Obj_t *, int, int)");
    }
    if (p->pSat->qtail != p->pSat->qhead) {
      __assert_fail("p->pSat->qtail == p->pSat->qhead",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSat.c"
                    ,0xff,"int Fra_NodesAreImp(Fra_Man_t *, Aig_Obj_t *, Aig_Obj_t *, int, int)");
    }
  }
  if (p->pPars->fConeBias != 0) {
    Fra_SetActivityFactors(p,pOld,pNew);
  }
  local_50 = pNew;
  iVar3 = clock_gettime(3,&local_60);
  if (iVar3 < 0) {
    lVar6 = 1;
  }
  else {
    lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_60.tv_nsec),8);
    lVar6 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_60.tv_sec * -1000000;
  }
  local_48 = CONCAT44((uint)(fComplR == 0) +
                      *(int *)(*(long *)((long)(local_50->field_5).pData + 0x98) +
                              (long)local_50->Id * 4) * 2,
                      (uint)(fComplL != 0) +
                      *(int *)(*(long *)((long)(pOld->field_5).pData + 0x98) + (long)pOld->Id * 4) *
                      2);
  iVar4 = sat_solver_solve(p->pSat,(lit *)&local_48,local_40,(long)iVar4,0,p->nBTLimitGlobal,
                           p->nInsLimitGlobal);
  iVar3 = clock_gettime(3,&local_60);
  pAVar2 = local_50;
  if (iVar3 < 0) {
    lVar7 = -1;
  }
  else {
    lVar7 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
  }
  p->timeSat = p->timeSat + lVar7 + lVar6;
  if (iVar4 == 1) {
    iVar4 = clock_gettime(3,&local_60);
    if (iVar4 < 0) {
      lVar7 = -1;
    }
    else {
      lVar7 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
    }
    p->timeSatSat = p->timeSatSat + lVar7 + lVar6;
    Fra_SmlSavePattern(p);
    iVar4 = 0;
    lVar6 = 0xd4;
  }
  else if (iVar4 == -1) {
    iVar4 = clock_gettime(3,&local_60);
    if (iVar4 < 0) {
      lVar7 = -1;
    }
    else {
      lVar7 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
    }
    p->timeSatUnsat = p->timeSatUnsat + lVar7 + lVar6;
    local_48 = local_48 ^ 0x100000001;
    iVar4 = sat_solver_addclause(p->pSat,(lit *)&local_48,local_40);
    if (iVar4 == 0) {
      __assert_fail("RetValue",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSat.c"
                    ,0x118,"int Fra_NodesAreImp(Fra_Man_t *, Aig_Obj_t *, Aig_Obj_t *, int, int)");
    }
    p->nSatCallsUnsat = p->nSatCallsUnsat + 1;
    iVar4 = 1;
    lVar6 = 0xdc;
  }
  else {
    iVar4 = clock_gettime(3,&local_60);
    if (iVar4 < 0) {
      lVar7 = -1;
    }
    else {
      lVar7 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
    }
    p->timeSatFail = p->timeSatFail + lVar7 + lVar6;
    if (p->pManFraig->pConst1 != pOld) {
      pOld->field_0x18 = pOld->field_0x18 | 0x20;
    }
    pAVar2->field_0x18 = pAVar2->field_0x18 | 0x20;
    iVar4 = -1;
    lVar6 = 0xe4;
  }
  piVar1 = (int *)((long)&p->pPars + lVar6);
  *piVar1 = *piVar1 + 1;
  return iVar4;
}

Assistant:

int Fra_NodesAreImp( Fra_Man_t * p, Aig_Obj_t * pOld, Aig_Obj_t * pNew, int fComplL, int fComplR )
{
    int pLits[4], RetValue, RetValue1, nBTLimit;
    abctime clk;//, clk2 = Abc_Clock();
    int status;

    // make sure the nodes are not complemented
    assert( !Aig_IsComplement(pNew) );
    assert( !Aig_IsComplement(pOld) );
    assert( pNew != pOld );

    // if at least one of the nodes is a failed node, perform adjustments:
    // if the backtrack limit is small, simply skip this node
    // if the backtrack limit is > 10, take the quare root of the limit
    nBTLimit = p->pPars->nBTLimitNode;
/*
    if ( !p->pPars->fSpeculate && p->pPars->nFramesK == 0 && (nBTLimit > 0 && (pOld->fMarkB || pNew->fMarkB)) )
    {
        p->nSatFails++;
        // fail immediately
//        return -1;
        if ( nBTLimit <= 10 )
            return -1;
        nBTLimit = (int)pow(nBTLimit, 0.7);
    }
*/
    p->nSatCalls++;

    // make sure the solver is allocated and has enough variables
    if ( p->pSat == NULL )
    {
        p->pSat = sat_solver_new();
        p->nSatVars = 1;
        sat_solver_setnvars( p->pSat, 1000 );
        // var 0 is reserved for const1 node - add the clause
        pLits[0] = toLit( 0 );
        sat_solver_addclause( p->pSat, pLits, pLits + 1 );
    }

    // if the nodes do not have SAT variables, allocate them
    Fra_CnfNodeAddToSolver( p, pOld, pNew );

    if ( p->pSat->qtail != p->pSat->qhead )
    {
        status = sat_solver_simplify(p->pSat);
        assert( status != 0 );
        assert( p->pSat->qtail == p->pSat->qhead );
    }

    // prepare variable activity
    if ( p->pPars->fConeBias )
        Fra_SetActivityFactors( p, pOld, pNew ); 

    // solve under assumptions
    // A = 1; B = 0     OR     A = 1; B = 1 
clk = Abc_Clock();
//    pLits[0] = toLitCond( Fra_ObjSatNum(pOld), 0 );
//    pLits[1] = toLitCond( Fra_ObjSatNum(pNew), pOld->fPhase == pNew->fPhase );
    pLits[0] = toLitCond( Fra_ObjSatNum(pOld),  fComplL );
    pLits[1] = toLitCond( Fra_ObjSatNum(pNew), !fComplR );
//Sat_SolverWriteDimacs( p->pSat, "temp.cnf", pLits, pLits + 2, 1 );
    RetValue1 = sat_solver_solve( p->pSat, pLits, pLits + 2, 
        (ABC_INT64_T)nBTLimit, (ABC_INT64_T)0, 
        p->nBTLimitGlobal, p->nInsLimitGlobal );
p->timeSat += Abc_Clock() - clk;
    if ( RetValue1 == l_False )
    {
p->timeSatUnsat += Abc_Clock() - clk;
        pLits[0] = lit_neg( pLits[0] );
        pLits[1] = lit_neg( pLits[1] );
        RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 2 );
        assert( RetValue );
        // continue solving the other implication
        p->nSatCallsUnsat++;
    }
    else if ( RetValue1 == l_True )
    {
p->timeSatSat += Abc_Clock() - clk;
        Fra_SmlSavePattern( p );
        p->nSatCallsSat++;
        return 0;
    }
    else // if ( RetValue1 == l_Undef )
    {
p->timeSatFail += Abc_Clock() - clk;
        // mark the node as the failed node
        if ( pOld != p->pManFraig->pConst1 ) 
            pOld->fMarkB = 1;
        pNew->fMarkB = 1;
        p->nSatFailsReal++;
        return -1;
    }
    // return SAT proof
    p->nSatProof++;
    return 1;
}